

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConditionalStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalStatementSyntax,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ConditionalPredicateSyntax&,slang::parsing::Token&,slang::syntax::StatementSyntax&,slang::syntax::ElseClauseSyntax*&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,Token *args_3,
          Token *args_4,ConditionalPredicateSyntax *args_5,Token *args_6,StatementSyntax *args_7,
          ElseClauseSyntax **args_8)

{
  Token uniqueOrPriority;
  Token ifKeyword;
  Token openParen;
  Token closeParen;
  ConditionalStatementSyntax *this_00;
  Token *args_local_4;
  Token *args_local_3;
  Token *args_local_2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_local_1;
  NamedLabelSyntax **args_local;
  BumpAllocator *this_local;
  
  this_00 = (ConditionalStatementSyntax *)allocate(this,0xa0,8);
  uniqueOrPriority.kind = args_2->kind;
  uniqueOrPriority._2_1_ = args_2->field_0x2;
  uniqueOrPriority.numFlags.raw = (args_2->numFlags).raw;
  uniqueOrPriority.rawLen = args_2->rawLen;
  uniqueOrPriority.info = args_2->info;
  ifKeyword.kind = args_3->kind;
  ifKeyword._2_1_ = args_3->field_0x2;
  ifKeyword.numFlags.raw = (args_3->numFlags).raw;
  ifKeyword.rawLen = args_3->rawLen;
  ifKeyword.info = args_3->info;
  openParen.kind = args_4->kind;
  openParen._2_1_ = args_4->field_0x2;
  openParen.numFlags.raw = (args_4->numFlags).raw;
  openParen.rawLen = args_4->rawLen;
  openParen.info = args_4->info;
  closeParen.kind = args_6->kind;
  closeParen._2_1_ = args_6->field_0x2;
  closeParen.numFlags.raw = (args_6->numFlags).raw;
  closeParen.rawLen = args_6->rawLen;
  closeParen.info = args_6->info;
  slang::syntax::ConditionalStatementSyntax::ConditionalStatementSyntax
            (this_00,*args,args_1,uniqueOrPriority,ifKeyword,openParen,args_5,closeParen,args_7,
             *args_8);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }